

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileListOperation<double,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<int,duckdb::QuantileStandardType>>
               (QuantileState<int,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  long lVar2;
  size_type *psVar3;
  Vector *pVVar4;
  uint64_t uVar5;
  reference pvVar6;
  unsigned_long *q;
  size_type *psVar7;
  idx_t iVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  Interpolator<false> interp;
  QuantileDirect<int> local_a9;
  list_entry_t *local_a8;
  AggregateFinalizeData *local_a0;
  long local_98;
  FunctionData *local_90;
  pointer local_88;
  Vector *local_80;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  
  if ((state->v).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    pVVar4 = (Vector *)duckdb::ListVector::GetEntry(finalize_data->result);
    uVar5 = duckdb::ListVector::GetListSize(finalize_data->result);
    local_a0 = finalize_data;
    duckdb::ListVector::Reserve
              (finalize_data->result,
               (*(long *)(pFVar1 + 0x10) - *(long *)(pFVar1 + 8) >> 3) * 0x4ec4ec4ec4ec4ec5 + uVar5)
    ;
    lVar2 = *(long *)(pVVar4 + 0x20);
    local_88 = (state->v).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    target->offset = uVar5;
    psVar7 = *(size_type **)(pFVar1 + 0x20);
    psVar3 = *(size_type **)(pFVar1 + 0x28);
    local_a8 = target;
    local_80 = pVVar4;
    if (psVar7 != psVar3) {
      local_90 = pFVar1 + 8;
      local_98 = lVar2 + uVar5 * 8;
      uVar9 = 0;
      do {
        pvVar6 = vector<duckdb::QuantileValue,_true>::operator[]
                           ((vector<duckdb::QuantileValue,_true> *)local_90,*psVar7);
        iVar8 = (long)(state->v).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish -
                (long)(state->v).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start >> 2;
        local_78.desc = *(bool *)(pFVar1 + 0x38);
        lVar2 = iVar8 - 1;
        auVar11._8_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar11._0_8_ = lVar2;
        auVar11._12_4_ = 0x45300000;
        dStack_40 = auVar11._8_8_ - 1.9342813113834067e+25;
        local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
                      pvVar6->dbl;
        local_48 = local_78.RN;
        dVar10 = floor(local_78.RN);
        local_78.FRN = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
        dVar10 = ceil(local_48);
        local_78.CRN = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
        local_78.begin = uVar9;
        local_78.end = iVar8;
        dVar10 = Interpolator<false>::Operation<int,double,duckdb::QuantileDirect<int>>
                           (&local_78,local_88,local_80,&local_a9);
        *(double *)(local_98 + *psVar7 * 8) = dVar10;
        psVar7 = psVar7 + 1;
        uVar9 = local_78.FRN;
      } while (psVar7 != psVar3);
    }
    uVar5 = (*(long *)(pFVar1 + 0x10) - *(long *)(pFVar1 + 8) >> 3) * 0x4ec4ec4ec4ec4ec5;
    local_a8->length = uVar5;
    duckdb::ListVector::SetListSize(local_a0->result,uVar5 + local_a8->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}